

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3SubInt64(i64 *pA,i64 iB)

{
  ulong uVar1;
  
  uVar1 = *pA;
  if (iB == -0x8000000000000000) {
    if (-1 < (long)uVar1) {
      return 1;
    }
    uVar1 = uVar1 & 0x7fffffffffffffff;
  }
  else {
    if (iB < 1) {
      if ((0 < (long)uVar1) &&
         (SBORROW8(0x7fffffffffffffff - uVar1,-iB) != (long)((0x7fffffffffffffff - uVar1) + iB) < 0)
         ) {
        return 1;
      }
    }
    else if (((long)uVar1 < 0) && (1 - iB < (long)(-0x7fffffffffffffff - uVar1))) {
      return 1;
    }
    uVar1 = uVar1 - iB;
  }
  *pA = uVar1;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3SubInt64(i64 *pA, i64 iB){
#if GCC_VERSION>=5004000 && !defined(__INTEL_COMPILER)
  return __builtin_sub_overflow(*pA, iB, pA);
#else
  testcase( iB==SMALLEST_INT64+1 );
  if( iB==SMALLEST_INT64 ){
    testcase( (*pA)==(-1) ); testcase( (*pA)==0 );
    if( (*pA)>=0 ) return 1;
    *pA -= iB;
    return 0;
  }else{
    return sqlite3AddInt64(pA, -iB);
  }
#endif
}